

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O2

REF_STATUS
ref_import_bin_ugrid_chunk(FILE *file,REF_BOOL swap,REF_BOOL fat,REF_INT n,REF_INT *chunk)

{
  uint uVar1;
  ulong uVar2;
  void *__ptr;
  size_t sVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  ulong uVar7;
  
  if (fat == 0) {
    uVar7 = (ulong)n;
    sVar3 = fread(chunk,4,uVar7,(FILE *)file);
    if (sVar3 == uVar7) {
      if (swap == 0) {
        return 0;
      }
      uVar7 = (ulong)(uint)n;
      if (n < 1) {
        uVar7 = 0;
      }
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        uVar1 = chunk[uVar4];
        chunk[uVar4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18;
      }
      return 0;
    }
    pcVar6 = "int chunk";
    uVar5 = 0x1da;
  }
  else {
    if (n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x1ce,"ref_import_bin_ugrid_chunk","malloc actual of REF_LONG negative");
      return 1;
    }
    uVar7 = (ulong)(uint)n;
    __ptr = malloc(uVar7 * 8);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x1ce,"ref_import_bin_ugrid_chunk","malloc actual of REF_LONG NULL");
      return 2;
    }
    sVar3 = fread(__ptr,8,uVar7,(FILE *)file);
    if (sVar3 == uVar7) {
      if (swap != 0) {
        for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          uVar2 = *(ulong *)((long)__ptr + uVar4 * 8);
          *(ulong *)((long)__ptr + uVar4 * 8) =
               uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
        }
      }
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        chunk[uVar4] = *(REF_INT *)((long)__ptr + uVar4 * 8);
      }
      free(__ptr);
      return 0;
    }
    pcVar6 = "long chunk";
    uVar5 = 0x1cf;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar5,
         "ref_import_bin_ugrid_chunk",pcVar6,uVar7,sVar3);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid_chunk(FILE *file, REF_BOOL swap,
                                                     REF_BOOL fat, REF_INT n,
                                                     REF_INT *chunk) {
  REF_INT i;
  if (fat) {
    REF_LONG *actual;
    ref_malloc(actual, n, REF_LONG);
    REIS(n, fread(actual, sizeof(REF_LONG), (size_t)(n), file), "long chunk");
    if (swap) {
      for (i = 0; i < n; i++) {
        SWAP_LONG(actual[i]);
      }
    }
    for (i = 0; i < n; i++) {
      chunk[i] = (REF_INT)actual[i];
    }
    ref_free(actual);
  } else {
    REIS(n, fread(chunk, sizeof(REF_INT), (size_t)(n), file), "int chunk");
    if (swap) {
      for (i = 0; i < n; i++) {
        SWAP_INT(chunk[i]);
      }
    }
  }

  return REF_SUCCESS;
}